

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgflusher.cc
# Opt level: O2

void bgflusher_deregister_file(filemgr *file)

{
  avl_node **ppaVar1;
  avl_node *node;
  openfiles_elem query;
  char local_530 [1296];
  avl_node local_20;
  
  if (bgflusher_initialized != '\0') {
    strcpy(local_530,file->filename);
    pthread_mutex_lock((pthread_mutex_t *)&bgf_lock);
    node = avl_search(&openfiles,&local_20,_bgflusher_cmp);
    if (node != (avl_node *)0x0) {
      ppaVar1 = &node[-1].left;
      *(int *)ppaVar1 = *(int *)ppaVar1 + -1;
      if (*(int *)ppaVar1 == 0) {
        if (*(char *)((long)&node[-1].left + 4) == '\x01') {
          node[-0xc].right = (avl_node *)0x0;
        }
        else {
          avl_remove(&openfiles,node);
          free(node + -0x36);
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
  }
  return;
}

Assistant:

void bgflusher_deregister_file(struct filemgr *file)
{
    if (!bgflusher_initialized) return;

    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    strcpy(query.filename, file->filename);
    mutex_lock(&bgf_lock);
    a = avl_search(&openfiles, &query.avl, _bgflusher_cmp);
    if (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        if ((--elem->register_count) == 0) {
            // if no handle refers this file
            if (elem->background_flush_in_progress) {
                // Background flusher is writing blocks while the file is closed.
                // Do not remove 'elem' for now. The 'elem' will be automatically
                // removed once background flushing is done. Set elem->file
                // to NULL to indicate this intent.
                elem->file = NULL;
            } else {
                // remove from the tree
                avl_remove(&openfiles, &elem->avl);
                free(elem);
            }
        }
    }
    mutex_unlock(&bgf_lock);
}